

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDiameterDimension::IfcDiameterDimension(IfcDiameterDimension *this)

{
  *(undefined ***)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = &PTR__Object_007331c0
  ;
  *(undefined8 *)&this->field_0x70 = 0;
  *(char **)&this->field_0x78 = "IfcDiameterDimension";
  IfcDimensionCurveDirectedCallout::IfcDimensionCurveDirectedCallout
            (&this->super_IfcDimensionCurveDirectedCallout,&PTR_construction_vtable_24__007a8638);
  (this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7a8558;
  *(undefined8 *)&(this->super_IfcDimensionCurveDirectedCallout).field_0x68 = 0x7a8620;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7a8580;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7a85a8;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x48 = 0x7a85d0;
  *(undefined8 *)
   &(this->super_IfcDimensionCurveDirectedCallout).super_IfcDraughtingCallout.field_0x58 = 0x7a85f8;
  return;
}

Assistant:

IfcDiameterDimension() : Object("IfcDiameterDimension") {}